

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

ACCEPTED_HANDLE accepted_clone(ACCEPTED_HANDLE value)

{
  AMQP_VALUE pAVar1;
  ACCEPTED_HANDLE local_18;
  ACCEPTED_INSTANCE *accepted_instance;
  ACCEPTED_HANDLE value_local;
  
  local_18 = (ACCEPTED_HANDLE)malloc(8);
  if (local_18 != (ACCEPTED_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    local_18->composite_value = pAVar1;
    if (local_18->composite_value == (AMQP_VALUE)0x0) {
      free(local_18);
      local_18 = (ACCEPTED_HANDLE)0x0;
    }
  }
  return local_18;
}

Assistant:

ACCEPTED_HANDLE accepted_clone(ACCEPTED_HANDLE value)
{
    ACCEPTED_INSTANCE* accepted_instance = (ACCEPTED_INSTANCE*)malloc(sizeof(ACCEPTED_INSTANCE));
    if (accepted_instance != NULL)
    {
        accepted_instance->composite_value = amqpvalue_clone(((ACCEPTED_INSTANCE*)value)->composite_value);
        if (accepted_instance->composite_value == NULL)
        {
            free(accepted_instance);
            accepted_instance = NULL;
        }
    }

    return accepted_instance;
}